

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  int in_R8D;
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_add op;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_250;
  undefined8 uStack_248;
  int local_194;
  float *local_180;
  float *local_178;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  fVar1 = *in_RDI;
  local_194 = 0;
  if (in_R8D == 4) {
    local_250 = *(undefined8 *)in_RDI;
    uStack_248 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_250 = CONCAT44(fVar1,fVar1);
    uStack_248 = CONCAT44(fVar1,fVar1);
  }
  local_180 = in_RDX;
  local_178 = in_RSI;
  if (in_R8D == 8) {
    local_280 = *(undefined8 *)in_RDI;
    uStack_278 = *(undefined8 *)(in_RDI + 2);
    uStack_270 = *(undefined8 *)(in_RDI + 4);
    uStack_268 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_280 = local_250;
    uStack_278 = uStack_248;
    uStack_270 = local_250;
    uStack_268 = uStack_248;
  }
  for (; local_194 + 7 < in_ECX; local_194 = local_194 + 8) {
    local_a0 = (float)local_280;
    fStack_9c = (float)((ulong)local_280 >> 0x20);
    fStack_98 = (float)uStack_278;
    fStack_94 = (float)((ulong)uStack_278 >> 0x20);
    fStack_90 = (float)uStack_270;
    fStack_8c = (float)((ulong)uStack_270 >> 0x20);
    fStack_88 = (float)uStack_268;
    fStack_84 = (float)((ulong)uStack_268 >> 0x20);
    local_c0 = (float)*(undefined8 *)local_178;
    fStack_bc = (float)((ulong)*(undefined8 *)local_178 >> 0x20);
    fStack_b8 = (float)*(undefined8 *)(local_178 + 2);
    fStack_b4 = (float)((ulong)*(undefined8 *)(local_178 + 2) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(local_178 + 4);
    fStack_ac = (float)((ulong)*(undefined8 *)(local_178 + 4) >> 0x20);
    fStack_a8 = (float)*(undefined8 *)(local_178 + 6);
    fStack_a4 = (float)((ulong)*(undefined8 *)(local_178 + 6) >> 0x20);
    *(ulong *)local_180 = CONCAT44(fStack_9c + fStack_bc,local_a0 + local_c0);
    *(ulong *)(local_180 + 2) = CONCAT44(fStack_94 + fStack_b4,fStack_98 + fStack_b8);
    *(ulong *)(local_180 + 4) = CONCAT44(fStack_8c + fStack_ac,fStack_90 + fStack_b0);
    *(ulong *)(local_180 + 6) = CONCAT44(fStack_84 + fStack_a4,fStack_88 + fStack_a8);
    local_178 = local_178 + 8;
    local_180 = local_180 + 8;
  }
  for (; local_194 + 3 < in_ECX; local_194 = local_194 + 4) {
    local_70 = (float)local_250;
    fStack_6c = (float)((ulong)local_250 >> 0x20);
    fStack_68 = (float)uStack_248;
    fStack_64 = (float)((ulong)uStack_248 >> 0x20);
    local_80 = (float)*(undefined8 *)local_178;
    fStack_7c = (float)((ulong)*(undefined8 *)local_178 >> 0x20);
    fStack_78 = (float)*(undefined8 *)(local_178 + 2);
    fStack_74 = (float)((ulong)*(undefined8 *)(local_178 + 2) >> 0x20);
    *(ulong *)local_180 = CONCAT44(fStack_6c + fStack_7c,local_70 + local_80);
    *(ulong *)(local_180 + 2) = CONCAT44(fStack_64 + fStack_74,fStack_68 + fStack_78);
    local_178 = local_178 + 4;
    local_180 = local_180 + 4;
  }
  for (; local_194 < in_ECX; local_194 = local_194 + 1) {
    *local_180 = fVar1 + *local_178;
    local_178 = local_178 + 1;
    local_180 = local_180 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}